

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object___getClass(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ulong uVar1;
  JSAtom atom;
  JSValue JVar2;
  
  atom = 0x2f;
  if ((int)argv->tag == -1) {
    uVar1 = (ulong)*(ushort *)((long)(argv->u).ptr + 6);
    if ((uVar1 == 0x29) &&
       (uVar1 = 0xd, *(char *)(*(long *)((long)(argv->u).ptr + 0x30) + 0x20) == '\0')) {
      uVar1 = 0x29;
    }
    atom = ctx->rt->class_array[uVar1].class_name;
  }
  JVar2 = __JS_AtomToValue(ctx,atom,1);
  return JVar2;
}

Assistant:

static JSValue js_object___getClass(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSAtom atom;
    JSObject *p;
    uint32_t tag;
    int class_id;

    tag = JS_VALUE_GET_NORM_TAG(argv[0]);
    if (tag == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(argv[0]);
        class_id = p->class_id;
        if (class_id == JS_CLASS_PROXY && JS_IsFunction(ctx, argv[0]))
            class_id = JS_CLASS_BYTECODE_FUNCTION;
        atom = ctx->rt->class_array[class_id].class_name;
    } else {
        atom = JS_ATOM_empty_string;
    }
    return JS_AtomToString(ctx, atom);
}